

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O3

CordzInfo * __thiscall absl::cord_internal::CordzInfo::Head(CordzInfo *this,CordzSnapshot *snapshot)

{
  undefined8 uVar1;
  bool bVar2;
  CordzInfo *pCVar3;
  CordzInfo *extraout_RAX;
  int64_t sampling_stride;
  MethodIdentifier method;
  CordzInfo *pCVar4;
  
  uVar1 = global_list_._8_8_;
  if ((this->super_CordzHandle).is_snapshot_ == false) {
    Head();
  }
  else {
    snapshot = (CordzSnapshot *)global_list_._8_8_;
    bVar2 = CordzHandle::DiagnosticsHandleIsSafeToInspect
                      (&this->super_CordzHandle,(CordzHandle *)global_list_._8_8_);
    if (bVar2) {
      return (CordzInfo *)uVar1;
    }
  }
  Head();
  if ((((CordzInfo *)snapshot)->super_CordzHandle).is_snapshot_ == false) {
    Next();
    method = (MethodIdentifier)snapshot;
  }
  else {
    pCVar3 = (this->ci_next_)._M_b._M_p;
    pCVar4 = (CordzInfo *)snapshot;
    bVar2 = CordzHandle::DiagnosticsHandleIsSafeToInspect
                      ((CordzHandle *)snapshot,&this->super_CordzHandle);
    method = (MethodIdentifier)this;
    this = pCVar4;
    if (bVar2) {
      pCVar4 = pCVar3;
      bVar2 = CordzHandle::DiagnosticsHandleIsSafeToInspect
                        ((CordzHandle *)snapshot,&pCVar3->super_CordzHandle);
      method = (MethodIdentifier)pCVar4;
      if (bVar2) {
        return pCVar3;
      }
      goto LAB_0017538a;
    }
  }
  snapshot = (CordzSnapshot *)this;
  Next();
LAB_0017538a:
  Next();
  if (((ulong)(((CordzInfo *)snapshot)->super_CordzHandle)._vptr_CordzHandle & 1) == 0) {
    __assert_fail("cord.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cordz_info.cc"
                  ,0xfa,
                  "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, MethodIdentifier, int64_t)"
                 );
  }
  if ((((CordzInfo *)snapshot)->super_CordzHandle)._vptr_CordzHandle == (_func_int **)0x1) {
    pCVar3 = (CordzInfo *)operator_new(0x540);
    CordzInfo(pCVar3,*(CordRep **)&(((CordzInfo *)snapshot)->super_CordzHandle).is_snapshot_,
              (CordzInfo *)0x0,method,sampling_stride);
    if (((ulong)(((CordzInfo *)snapshot)->super_CordzHandle)._vptr_CordzHandle & 1) != 0) {
      (((CordzInfo *)snapshot)->super_CordzHandle)._vptr_CordzHandle =
           (_func_int **)((ulong)pCVar3 | 1);
      Track(pCVar3);
      return extraout_RAX;
    }
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                  ,0x24b,"void absl::cord_internal::InlineData::set_cordz_info(CordzInfo *)");
  }
  __assert_fail("!cord.is_profiled()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cordz_info.cc"
                ,0xfb,
                "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, MethodIdentifier, int64_t)"
               );
}

Assistant:

CordzInfo* CordzInfo::Head(const CordzSnapshot& snapshot) {
  ABSL_ASSERT(snapshot.is_snapshot());

  // We can do an 'unsafe' load of 'head', as we are guaranteed that the
  // instance it points to is kept alive by the provided CordzSnapshot, so we
  // can simply return the current value using an acquire load.
  // We do enforce in DEBUG builds that the 'head' value is present in the
  // delete queue: ODR violations may lead to 'snapshot' and 'global_list_'
  // being in different libraries / modules.
  CordzInfo* head = global_list_.head.load(std::memory_order_acquire);
  ABSL_ASSERT(snapshot.DiagnosticsHandleIsSafeToInspect(head));
  return head;
}